

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaTypePtr xmlSchemaGetPredefinedType(xmlChar *name,xmlChar *ns)

{
  int iVar1;
  xmlSchemaTypePtr pxVar2;
  
  if (xmlSchemaTypesInitialized == '\0') {
    iVar1 = xmlSchemaInitTypes();
    if (name == (xmlChar *)0x0 || iVar1 < 0) {
      return (xmlSchemaTypePtr)0x0;
    }
  }
  else if (name == (xmlChar *)0x0) {
    return (xmlSchemaTypePtr)0x0;
  }
  pxVar2 = (xmlSchemaTypePtr)xmlHashLookup2(xmlSchemaTypesBank,name,ns);
  return pxVar2;
}

Assistant:

xmlSchemaTypePtr
xmlSchemaGetPredefinedType(const xmlChar *name, const xmlChar *ns) {
    if ((xmlSchemaTypesInitialized == 0) &&
	(xmlSchemaInitTypes() < 0))
        return (NULL);
    if (name == NULL)
	return(NULL);
    return((xmlSchemaTypePtr) xmlHashLookup2(xmlSchemaTypesBank, name, ns));
}